

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::Runner::~Runner(Runner *this)

{
  Ptr<Catch::Config> *in_RDI;
  
  std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::~set
            ((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *)
             0x1a203f);
  Ptr<Catch::IStreamingReporter>::~Ptr((Ptr<Catch::IStreamingReporter> *)in_RDI);
  std::ofstream::~ofstream(in_RDI + 1);
  Ptr<Catch::Config>::~Ptr(in_RDI);
  return;
}

Assistant:

Runner( Ptr<Config> const& config )
        :   m_config( config )
        {
            openStream();
            makeReporter();
        }